

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

SPIRVariable * __thiscall
spirv_cross::Compiler::maybe_get_backing_variable(Compiler *this,uint32_t chain)

{
  SPIRVariable *pSVar1;
  SPIRExpression *pSVar2;
  ulong uVar3;
  SPIRAccessChain *pSVar4;
  ulong uVar5;
  Variant *pVVar6;
  ulong uVar7;
  
  uVar7 = (ulong)chain;
  uVar5 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  if (uVar5 <= uVar7) goto LAB_00381490;
  pVVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar6[uVar7].type == TypeVariable) {
    pVVar6 = pVVar6 + uVar7;
    goto LAB_00381446;
  }
  pVVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar6[uVar7].type == TypeExpression) {
    pSVar2 = Variant::get<spirv_cross::SPIRExpression>(pVVar6 + uVar7);
    uVar3 = (ulong)(pSVar2->loaded_from).id;
    uVar5 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
    if ((uVar5 <= uVar3) ||
       (pVVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar6[uVar3].type != TypeVariable)) goto LAB_00381490;
    pSVar1 = Variant::get<spirv_cross::SPIRVariable>(pVVar6 + uVar3);
    uVar5 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  }
  else {
LAB_00381490:
    pSVar1 = (SPIRVariable *)0x0;
  }
  if ((uVar7 < uVar5) &&
     (pVVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar6[uVar7].type == TypeAccessChain)) {
    pSVar4 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar6 + uVar7);
    uVar5 = (ulong)(pSVar4->loaded_from).id;
    if ((uVar5 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar6[uVar5].type == TypeVariable)) {
      pVVar6 = pVVar6 + uVar5;
LAB_00381446:
      pSVar1 = Variant::get<spirv_cross::SPIRVariable>(pVVar6);
      return pSVar1;
    }
    pSVar1 = (SPIRVariable *)0x0;
  }
  return pSVar1;
}

Assistant:

SPIRVariable *Compiler::maybe_get_backing_variable(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		auto *cexpr = maybe_get<SPIRExpression>(chain);
		if (cexpr)
			var = maybe_get<SPIRVariable>(cexpr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	return var;
}